

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int nh_http_parse_consume_body(http_context_t *ctx)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = ctx->body_len;
  if ((ctx->body).index == 0) {
    (ctx->body).index = (ctx->raw).index;
  }
  uVar2 = (ctx->body).index;
  uVar3 = (ctx->raw).length - uVar2;
  uVar4 = uVar1;
  if ((uVar1 < uVar3) || (uVar4 = uVar3, (ctx->body).len < uVar1)) {
    (ctx->body).len = uVar4;
  }
  uVar4 = (ctx->body).len;
  (ctx->raw).index = uVar2 + uVar4;
  return (uint)(uVar4 == uVar1);
}

Assistant:

int nh_http_parse_consume_body(http_context_t *ctx) {
    uint32_t length = ctx->body_len;
    nh_stream_t *stream = &ctx->raw;
    if (ctx->body.index == 0) ctx->body.index = stream->index;
    if (stream->length - ctx->body.index > length) {
        ctx->body.len = length;
    } else if (ctx->body.len < length) {
        ctx->body.len = stream->length - ctx->body.index;
    }
    stream->index = ctx->body.index + ctx->body.len;
    return ctx->body.len == length;
}